

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O0

char * __thiscall
glcts::GeometryShaderRendering::getTestName
          (GeometryShaderRendering *this,_shader_input input,_shader_output_type output_type,
          GLenum drawcall_mode)

{
  TestError *pTVar1;
  char *local_28;
  char *result;
  GLenum drawcall_mode_local;
  _shader_output_type output_type_local;
  _shader_input input_local;
  GeometryShaderRendering *this_local;
  
  switch(input) {
  case SHADER_INPUT_POINTS:
    if (output_type == SHADER_OUTPUT_TYPE_POINTS) {
      local_28 = "points_input_points_output";
    }
    else if (output_type == SHADER_OUTPUT_TYPE_LINE_STRIP) {
      local_28 = "points_input_line_strip_output";
    }
    else {
      if (output_type != SHADER_OUTPUT_TYPE_TRIANGLE_STRIP) {
        pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar1,"Unrecognized shader output type requested",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0x56);
        __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_28 = "points_input_triangles_output";
    }
    break;
  case SHADER_INPUT_LINES:
    if (output_type == SHADER_OUTPUT_TYPE_POINTS) {
      if (drawcall_mode == 1) {
        local_28 = "lines_input_points_output_lines_drawcall";
      }
      else if (drawcall_mode == 2) {
        local_28 = "lines_input_points_output_line_loop_drawcall";
      }
      else {
        if (drawcall_mode != 3) {
          pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar1,"UNrecognized draw call mode",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0x88);
          __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        local_28 = "lines_input_points_output_line_strip_drawcall";
      }
    }
    else if (output_type == SHADER_OUTPUT_TYPE_LINE_STRIP) {
      if (drawcall_mode == 1) {
        local_28 = "lines_input_line_strip_output_lines_drawcall";
      }
      else if (drawcall_mode == 2) {
        local_28 = "lines_input_line_strip_output_line_loop_drawcall";
      }
      else {
        if (drawcall_mode != 3) {
          pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar1,"UNrecognized draw call mode",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0x71);
          __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        local_28 = "lines_input_line_strip_output_line_strip_drawcall";
      }
    }
    else {
      if (output_type != SHADER_OUTPUT_TYPE_TRIANGLE_STRIP) {
        pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar1,"Unrecognized shader output type requested",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0xa8);
        __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if (drawcall_mode == 1) {
        local_28 = "lines_input_triangle_strip_output_lines_drawcall";
      }
      else if (drawcall_mode == 2) {
        local_28 = "lines_input_triangle_strip_output_line_loop_drawcall";
      }
      else {
        if (drawcall_mode != 3) {
          pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar1,"UNrecognized draw call mode",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0x9f);
          __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        local_28 = "lines_input_triangle_strip_output_line_strip_drawcall";
      }
    }
    break;
  case SHADER_INPUT_LINES_WITH_ADJACENCY:
    if (output_type == SHADER_OUTPUT_TYPE_POINTS) {
      if ((drawcall_mode == 10) || (drawcall_mode == 10)) {
        local_28 = "lines_with_adjacency_input_points_output_lines_adjacency_drawcall";
      }
      else {
        if ((drawcall_mode != 0xb) && (drawcall_mode != 0xb)) {
          pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar1,"Unrecognized draw call mode",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0xd1);
          __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        local_28 = "lines_with_adjacency_input_points_output_line_strip_drawcall";
      }
    }
    else if (output_type == SHADER_OUTPUT_TYPE_LINE_STRIP) {
      if ((drawcall_mode == 10) || (drawcall_mode == 10)) {
        local_28 = "lines_with_adjacency_input_line_strip_output_lines_adjacency_drawcall";
      }
      else {
        if ((drawcall_mode != 0xb) && (drawcall_mode != 0xb)) {
          pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar1,"Unrecognized draw call mode",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0xbf);
          __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        local_28 = "lines_with_adjacency_input_line_strip_output_line_strip_drawcall";
      }
    }
    else {
      if (output_type != SHADER_OUTPUT_TYPE_TRIANGLE_STRIP) {
        pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar1,"Unrecognized shader output type requested",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0xeb);
        __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if ((drawcall_mode == 10) || (drawcall_mode == 10)) {
        local_28 = "lines_with_adjacency_input_triangle_strip_output_lines_adjacency_drawcall";
      }
      else {
        if ((drawcall_mode != 0xb) && (drawcall_mode != 0xb)) {
          pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar1,"Unrecognized draw call mode",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0xe3);
          __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        local_28 = "lines_with_adjacency_input_triangle_strip_output_line_strip_drawcall";
      }
    }
    break;
  case SHADER_INPUT_TRIANGLES:
    if (output_type == SHADER_OUTPUT_TYPE_POINTS) {
      if (drawcall_mode == 4) {
        local_28 = "triangles_input_points_output_triangles_drawcall";
      }
      else if (drawcall_mode == 5) {
        local_28 = "triangles_input_points_output_triangle_strip_drawcall";
      }
      else {
        if (drawcall_mode != 6) {
          pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar1,"Unrecognized draw call mode",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0x11d);
          __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        local_28 = "triangles_input_points_output_triangle_fan_drawcall";
      }
    }
    else if (output_type == SHADER_OUTPUT_TYPE_LINE_STRIP) {
      if (drawcall_mode == 4) {
        local_28 = "triangles_input_line_strip_output_triangles_drawcall";
      }
      else if (drawcall_mode == 5) {
        local_28 = "triangles_input_line_strip_output_triangle_strip_drawcall";
      }
      else {
        if (drawcall_mode != 6) {
          pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar1,"Unrecognized draw call mode",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0x106);
          __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        local_28 = "triangles_input_line_strip_output_triangle_fan_drawcall";
      }
    }
    else {
      if (output_type != SHADER_OUTPUT_TYPE_TRIANGLE_STRIP) {
        pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar1,"Unrecognized shader output type requested",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0x13d);
        __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if (drawcall_mode == 4) {
        local_28 = "triangles_input_triangle_strip_output_triangles_drawcall";
      }
      else if (drawcall_mode == 5) {
        local_28 = "triangles_input_triangle_strip_output_triangle_strip_drawcall";
      }
      else {
        if (drawcall_mode != 6) {
          pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar1,"Unrecognized draw call mode",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0x134);
          __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        local_28 = "triangles_input_triangle_strip_output_triangle_fan_drawcall";
      }
    }
    break;
  case SHADER_INPUT_TRIANGLES_WITH_ADJACENCY:
    if (output_type == SHADER_OUTPUT_TYPE_POINTS) {
      if ((drawcall_mode == 0xc) || (drawcall_mode == 0xc)) {
        local_28 = "triangles_with_adjacency_input_points_output_triangles_adjacency_drawcall";
      }
      else {
        if ((drawcall_mode != 0xd) && (drawcall_mode != 0xd)) {
          pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar1,"Unrecognized draw call mode",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0x169);
          __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        local_28 = "triangles_with_adjacency_input_points_output_triangle_strip_adjacency_drawcall";
      }
    }
    else if (output_type == SHADER_OUTPUT_TYPE_LINE_STRIP) {
      if ((drawcall_mode == 0xc) || (drawcall_mode == 0xc)) {
        local_28 = "triangles_with_adjacency_input_line_strip_output_triangles_adjacency_drawcall";
      }
      else {
        if ((drawcall_mode != 0xd) && (drawcall_mode != 0xd)) {
          pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar1,"Unrecognized draw call mode",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0x155);
          __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        local_28 = 
        "triangles_with_adjacency_input_line_strip_output_triangle_strip_adjacency_drawcall";
      }
    }
    else {
      if (output_type != SHADER_OUTPUT_TYPE_TRIANGLE_STRIP) {
        pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar1,"Unrecognized shader output type requested",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0x184);
        __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      if ((drawcall_mode == 0xc) || (drawcall_mode == 0xc)) {
        local_28 = 
        "triangles_with_adjacency_input_triangle_strip_output_triangles_adjacency_drawcall";
      }
      else {
        if ((drawcall_mode != 0xd) && (drawcall_mode != 0xd)) {
          pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar1,"Unrecognized draw call mode",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                     ,0x17c);
          __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        local_28 = 
        "triangles_with_adjacency_input_triangle_strip_output_triangle_strip_adjacency_drawcall";
      }
    }
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Unrecognized layout qualifier",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0x18e);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  return local_28;
}

Assistant:

const char* GeometryShaderRendering::getTestName(_shader_input input, _shader_output_type output_type,
												 glw::GLenum drawcall_mode)
{
	const char* result = NULL;

	switch (input)
	{
	case SHADER_INPUT_POINTS:
	{
		switch (output_type)
		{
		case SHADER_OUTPUT_TYPE_LINE_STRIP:
			result = "points_input_line_strip_output";
			break;
		case SHADER_OUTPUT_TYPE_POINTS:
			result = "points_input_points_output";
			break;
		case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
			result = "points_input_triangles_output";
			break;

		default:
		{
			TCU_FAIL("Unrecognized shader output type requested");
		}
		} /* switch (output_type) */

		break;
	}

	case SHADER_INPUT_LINES:
	{
		switch (output_type)
		{
		case SHADER_OUTPUT_TYPE_LINE_STRIP:
		{
			switch (drawcall_mode)
			{
			case GL_LINES:
				result = "lines_input_line_strip_output_lines_drawcall";
				break;
			case GL_LINE_STRIP:
				result = "lines_input_line_strip_output_line_strip_drawcall";
				break;
			case GL_LINE_LOOP:
				result = "lines_input_line_strip_output_line_loop_drawcall";
				break;

			default:
			{
				TCU_FAIL("UNrecognized draw call mode");
			}
			} /* switch (drawcall_mode) */

			break;
		} /* case SHADER_OUTPUT_TYPE_LINE_STRIP: */

		case SHADER_OUTPUT_TYPE_POINTS:
		{
			switch (drawcall_mode)
			{
			case GL_LINES:
				result = "lines_input_points_output_lines_drawcall";
				break;
			case GL_LINE_STRIP:
				result = "lines_input_points_output_line_strip_drawcall";
				break;
			case GL_LINE_LOOP:
				result = "lines_input_points_output_line_loop_drawcall";
				break;

			default:
			{
				TCU_FAIL("UNrecognized draw call mode");
			}
			} /* switch (drawcall_mode) */

			break;
		} /* case SHADER_OUTPUT_TYPE_POINTS: */

		case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
		{
			switch (drawcall_mode)
			{
			case GL_LINES:
				result = "lines_input_triangle_strip_output_lines_drawcall";
				break;
			case GL_LINE_STRIP:
				result = "lines_input_triangle_strip_output_line_strip_drawcall";
				break;
			case GL_LINE_LOOP:
				result = "lines_input_triangle_strip_output_line_loop_drawcall";
				break;

			default:
			{
				TCU_FAIL("UNrecognized draw call mode");
			}
			} /* switch (drawcall_mode) */

			break;
		} /* case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP: */

		default:
		{
			TCU_FAIL("Unrecognized shader output type requested");
		}
		} /* switch (output_type) */

		break;
	} /* case SHADER_INPUT_LINES:*/

	case SHADER_INPUT_LINES_WITH_ADJACENCY:
	{
		switch (output_type)
		{
		case SHADER_OUTPUT_TYPE_LINE_STRIP:
		{
			if ((drawcall_mode == GL_LINES_ADJACENCY_EXT) || (drawcall_mode == GL_LINES_ADJACENCY))
			{
				result = "lines_with_adjacency_input_line_strip_output_lines_adjacency_drawcall";
			}
			else if ((drawcall_mode == GL_LINE_STRIP_ADJACENCY_EXT) || (drawcall_mode == GL_LINE_STRIP_ADJACENCY))
			{
				result = "lines_with_adjacency_input_line_strip_output_line_strip_drawcall";
			}
			else
			{
				TCU_FAIL("Unrecognized draw call mode");
			}

			break;
		} /* case SHADER_OUTPUT_TYPE_LINE_STRIP: */

		case SHADER_OUTPUT_TYPE_POINTS:
		{
			if ((drawcall_mode == GL_LINES_ADJACENCY_EXT) || (drawcall_mode == GL_LINES_ADJACENCY))
			{
				result = "lines_with_adjacency_input_points_output_lines_adjacency_drawcall";
			}
			else if ((drawcall_mode == GL_LINE_STRIP_ADJACENCY_EXT) || (drawcall_mode == GL_LINE_STRIP_ADJACENCY))
			{
				result = "lines_with_adjacency_input_points_output_line_strip_drawcall";
			}
			else
			{
				TCU_FAIL("Unrecognized draw call mode");
			}

			break;
		} /* case SHADER_OUTPUT_TYPE_POINTS: */

		case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
		{
			if ((drawcall_mode == GL_LINES_ADJACENCY_EXT) || (drawcall_mode == GL_LINES_ADJACENCY))
			{
				result = "lines_with_adjacency_input_triangle_strip_output_lines_adjacency_drawcall";
			}
			else if ((drawcall_mode == GL_LINE_STRIP_ADJACENCY_EXT) || (drawcall_mode == GL_LINE_STRIP_ADJACENCY))
			{
				result = "lines_with_adjacency_input_triangle_strip_output_line_strip_drawcall";
			}
			else
			{
				TCU_FAIL("Unrecognized draw call mode");
			}

			break;
		} /* case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP: */

		default:
		{
			TCU_FAIL("Unrecognized shader output type requested");
		}
		} /* switch (output_type) */

		break;
	} /* case SHADER_INPUT_LINES_WITH_ADJACENCY: */

	case SHADER_INPUT_TRIANGLES:
	{
		switch (output_type)
		{
		case SHADER_OUTPUT_TYPE_LINE_STRIP:
		{
			switch (drawcall_mode)
			{
			case GL_TRIANGLES:
				result = "triangles_input_line_strip_output_triangles_drawcall";
				break;
			case GL_TRIANGLE_FAN:
				result = "triangles_input_line_strip_output_triangle_fan_drawcall";
				break;
			case GL_TRIANGLE_STRIP:
				result = "triangles_input_line_strip_output_triangle_strip_drawcall";
				break;

			default:
			{
				TCU_FAIL("Unrecognized draw call mode");
			}
			} /* switch (drawcall_mode) */

			break;
		} /* case SHADER_OUTPUT_TYPE_LINE_STRIP: */

		case SHADER_OUTPUT_TYPE_POINTS:
		{
			switch (drawcall_mode)
			{
			case GL_TRIANGLES:
				result = "triangles_input_points_output_triangles_drawcall";
				break;
			case GL_TRIANGLE_FAN:
				result = "triangles_input_points_output_triangle_fan_drawcall";
				break;
			case GL_TRIANGLE_STRIP:
				result = "triangles_input_points_output_triangle_strip_drawcall";
				break;

			default:
			{
				TCU_FAIL("Unrecognized draw call mode");
			}
			} /* switch (drawcall_mode) */

			break;
		} /* case SHADER_OUTPUT_TYPE_POINTS: */

		case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
		{
			switch (drawcall_mode)
			{
			case GL_TRIANGLES:
				result = "triangles_input_triangle_strip_output_triangles_drawcall";
				break;
			case GL_TRIANGLE_FAN:
				result = "triangles_input_triangle_strip_output_triangle_fan_drawcall";
				break;
			case GL_TRIANGLE_STRIP:
				result = "triangles_input_triangle_strip_output_triangle_strip_drawcall";
				break;

			default:
			{
				TCU_FAIL("Unrecognized draw call mode");
			}
			} /* switch (drawcall_mode) */

			break;
		} /* case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP: */

		default:
		{
			TCU_FAIL("Unrecognized shader output type requested");
		}
		} /* switch (output_type) */

		break;
	} /* case SHADER_INPUT_TRIANGLES: */

	case SHADER_INPUT_TRIANGLES_WITH_ADJACENCY:
	{
		switch (output_type)
		{
		case SHADER_OUTPUT_TYPE_LINE_STRIP:
		{
			if ((drawcall_mode == GL_TRIANGLES_ADJACENCY_EXT) || (drawcall_mode == GL_TRIANGLES_ADJACENCY))
			{
				result = "triangles_with_adjacency_input_line_strip_output_triangles_adjacency_drawcall";
			}
			else if ((drawcall_mode == GL_TRIANGLE_STRIP_ADJACENCY_EXT) ||
					 (drawcall_mode == GL_TRIANGLE_STRIP_ADJACENCY))
			{
				result = "triangles_with_adjacency_input_line_strip_output_triangle_strip_adjacency_drawcall";
			}
			else
			{
				TCU_FAIL("Unrecognized draw call mode");
			}

			break;
		} /* case SHADER_OUTPUT_TYPE_LINE_STRIP: */

		case SHADER_OUTPUT_TYPE_POINTS:
		{
			if ((drawcall_mode == GL_TRIANGLES_ADJACENCY_EXT) || (drawcall_mode == GL_TRIANGLES_ADJACENCY))
			{
				result = "triangles_with_adjacency_input_points_output_triangles_adjacency_drawcall";
			}
			else if ((drawcall_mode == GL_TRIANGLE_STRIP_ADJACENCY_EXT) ||
					 (drawcall_mode == GL_TRIANGLE_STRIP_ADJACENCY))
			{
				result = "triangles_with_adjacency_input_points_output_triangle_strip_adjacency_drawcall";
				break;
			}
			else
			{
				TCU_FAIL("Unrecognized draw call mode");
			}

			break;
		} /* case SHADER_OUTPUT_TYPE_POINTS:*/

		case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
		{
			if ((drawcall_mode == GL_TRIANGLES_ADJACENCY_EXT) || (drawcall_mode == GL_TRIANGLES_ADJACENCY))
			{
				result = "triangles_with_adjacency_input_triangle_strip_output_triangles_adjacency_drawcall";
			}
			else if ((drawcall_mode == GL_TRIANGLE_STRIP_ADJACENCY_EXT) ||
					 (drawcall_mode == GL_TRIANGLE_STRIP_ADJACENCY))
			{
				result = "triangles_with_adjacency_input_triangle_strip_output_triangle_strip_adjacency_drawcall";
			}
			else
			{
				TCU_FAIL("Unrecognized draw call mode");
			}

			break;
		} /* case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP: */

		default:
		{
			TCU_FAIL("Unrecognized shader output type requested");
		}
		} /* switch (output_type) */

		break;
	} /* case SHADER_INPUT_TRIANGLES_WITH_ADJACENCY: */

	default:
	{
		/* Unrecognized geometry shader input layout qualifier */
		TCU_FAIL("Unrecognized layout qualifier");
	}
	} /* switch (input) */

	return result;
}